

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O2

hrgls_Status hrgls_APICreateParametersGetName(hrgls_APICreateParams params,char **returnName)

{
  if (params == (hrgls_APICreateParams)0x0) {
    return 0x3ee;
  }
  if (returnName != (char **)0x0) {
    *returnName = (params->name)._M_dataplus._M_p;
    return 0;
  }
  return 0x3e9;
}

Assistant:

hrgls_Status hrgls_APICreateParametersGetName(hrgls_APICreateParams params,
    const char **returnName)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!returnName) {
      return hrgls_STATUS_BAD_PARAMETER;
    }
    *returnName = params->name.c_str();

    return s;
  }